

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O3

int lib_dlb_fread(char *buf,int size,int quan,dlb *dp)

{
  long *plVar1;
  long lVar2;
  library *plVar3;
  size_t sVar4;
  size_t __size;
  
  lVar2 = dp->size - dp->mark;
  __size = (size_t)size;
  if (lVar2 < quan * size) {
    quan = (int)(lVar2 / (long)__size);
  }
  if (quan == 0) {
    sVar4 = 0;
  }
  else {
    lVar2 = dp->mark + dp->start;
    plVar3 = dp->lib;
    if (plVar3->fmark != lVar2) {
      fseek((FILE *)plVar3->fdata,lVar2,0);
      plVar3 = dp->lib;
      plVar3->fmark = lVar2;
    }
    sVar4 = fread(buf,__size,(long)quan,(FILE *)plVar3->fdata);
    dp->mark = dp->mark + __size * sVar4;
    plVar1 = &dp->lib->fmark;
    *plVar1 = *plVar1 + __size * sVar4;
  }
  return (int)sVar4;
}

Assistant:

static int lib_dlb_fread(char *buf, int size, int quan, dlb *dp)
{
    long pos, nread, nbytes;

    /* make sure we don't read into the next file */
    if ((dp->size - dp->mark) < (size * quan))
	quan = (dp->size - dp->mark) / size;
    if (quan == 0) return 0;

    pos = dp->start + dp->mark;
    if (dp->lib->fmark != pos) {
	fseek(dp->lib->fdata, pos, SEEK_SET);	/* check for error??? */
	dp->lib->fmark = pos;
    }

    nread = fread(buf, size, quan, dp->lib->fdata);
    nbytes = nread * size;
    dp->mark += nbytes;
    dp->lib->fmark += nbytes;

    return nread;
}